

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_02_TimedText.cpp
# Opt level: O2

h__Reader * __thiscall
AS_02::TimedText::MXFReader::h__Reader::MD_to_TimedText_TDesc
          (h__Reader *this,TimedTextDescriptor *TDesc)

{
  pointer pcVar1;
  undefined8 uVar2;
  uint __line;
  long lVar3;
  ILogSink *this_00;
  MIMEType_t MVar4;
  undefined8 *in_RDX;
  char *__assertion;
  long lVar5;
  InterchangeObject *tmp_iobj;
  value_type local_118;
  pair<const_Kumu::UUID,_Kumu::UUID> local_100;
  Result_t result;
  
  pcVar1 = TDesc[8].EncodingName._M_dataplus._M_p;
  if (pcVar1 == (pointer)0x0) {
    __assertion = "m_EssenceDescriptor";
    __line = 0x59;
LAB_001482cd:
    __assert_fail(__assertion,
                  "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/AS_02_TimedText.cpp"
                  ,__line,
                  "ASDCP::Result_t AS_02::TimedText::MXFReader::h__Reader::MD_to_TimedText_TDesc(TimedTextDescriptor &)"
                 );
  }
  *(undefined8 *)((long)&TDesc[8].RFC5646LanguageTagList._M_string_length + 4) = 0;
  *(undefined8 *)((long)&TDesc[8].RFC5646LanguageTagList.field_2 + 4) = 0;
  *in_RDX = *(undefined8 *)(pcVar1 + 0xf0);
  if (pcVar1[0x100] == '\x01') {
    if (*(ulong *)(pcVar1 + 0xf8) >> 0x20 != 0) {
      __assertion = "TDescObj->ContainerDuration <= 0xFFFFFFFFL";
      __line = 0x60;
      goto LAB_001482cd;
    }
    *(int *)(in_RDX + 1) = (int)*(ulong *)(pcVar1 + 0xf8);
  }
  uVar2 = *(undefined8 *)(pcVar1 + 0x181);
  *(undefined8 *)((long)in_RDX + 0xc) = *(undefined8 *)(pcVar1 + 0x179);
  *(undefined8 *)((long)in_RDX + 0x14) = uVar2;
  std::__cxx11::string::_M_assign((string *)(in_RDX + 4));
  std::__cxx11::string::_M_assign((string *)(in_RDX + 8));
  lVar5 = *(long *)(pcVar1 + 200);
  Kumu::Result_t::Result_t(&result,(Result_t *)Kumu::RESULT_OK);
  while ((lVar5 != *(long *)(pcVar1 + 0xd0) && (-1 < _result))) {
    ASDCP::MXF::OP1aHeader::GetMDObjectByID
              (&local_100.first,(InterchangeObject **)(TDesc->AssetID + 0xc));
    Kumu::Result_t::operator=(&result,(Result_t *)&local_100);
    Kumu::Result_t::~Result_t((Result_t *)&local_100);
    if (_result < 0) {
      this_00 = (ILogSink *)Kumu::DefaultLogSink();
      Kumu::ILogSink::Error(this_00,"Broken sub-descriptor link\n");
      Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)ASDCP::RESULT_FORMAT);
      goto LAB_0014827b;
    }
    local_118.Type = MT_BIN;
    local_118.ResourceID[0] = (byte_t)uRam00000000000000a9;
    local_118.ResourceID[1] = uRam00000000000000a9._1_1_;
    local_118.ResourceID[2] = bRam00000000000000ab;
    local_118.ResourceID[3] = bRam00000000000000ac;
    local_118.ResourceID[4] = bRam00000000000000ad;
    local_118.ResourceID[5] = bRam00000000000000ae;
    local_118.ResourceID[6] = bRam00000000000000af;
    local_118.ResourceID[7] = bRam00000000000000b0;
    local_118.ResourceID[8] = (byte_t)uRam00000000000000b1;
    local_118.ResourceID[9] = uRam00000000000000b1._1_1_;
    local_118.ResourceID[10] = bRam00000000000000b3;
    local_118.ResourceID[0xb] = bRam00000000000000b4;
    local_118.ResourceID[0xc] = bRam00000000000000b5;
    local_118.ResourceID[0xd] = bRam00000000000000b6;
    local_118.ResourceID[0xe] = bRam00000000000000b7;
    local_118.ResourceID[0xf] = bRam00000000000000b8;
    lVar3 = std::__cxx11::string::find((char *)0xc8,0x156137);
    MVar4 = MT_OPENTYPE;
    if (lVar3 == -1) {
      lVar3 = std::__cxx11::string::find((char *)0xc8,0x1563b8);
      MVar4 = MT_OPENTYPE;
      if (lVar3 == -1) {
        lVar3 = std::__cxx11::string::find((char *)0xc8,0x1563cf);
        MVar4 = MT_OPENTYPE;
        if (lVar3 == -1) {
          lVar3 = std::__cxx11::string::find((char *)0xc8,0x15612d);
          MVar4 = (MIMEType_t)(lVar3 != -1);
        }
      }
    }
    local_118.Type = MVar4;
    std::__cxx11::
    list<ASDCP::TimedText::TimedTextResourceDescriptor,_std::allocator<ASDCP::TimedText::TimedTextResourceDescriptor>_>
    ::push_back((list<ASDCP::TimedText::TimedTextResourceDescriptor,_std::allocator<ASDCP::TimedText::TimedTextResourceDescriptor>_>
                 *)(in_RDX + 0xc),&local_118);
    local_100.first.super_Identifier<16U>.m_HasValue = (bool)uRam00000000000000a8;
    local_100.first.super_Identifier<16U>.m_Value[0] = (byte_t)uRam00000000000000a9;
    local_100.first.super_Identifier<16U>.m_Value[1] = uRam00000000000000a9._1_1_;
    local_100.first.super_Identifier<16U>.m_Value[2] = bRam00000000000000ab;
    local_100.first.super_Identifier<16U>.m_Value[3] = bRam00000000000000ac;
    local_100.first.super_Identifier<16U>.m_Value[4] = bRam00000000000000ad;
    local_100.first.super_Identifier<16U>.m_Value[5] = bRam00000000000000ae;
    local_100.first.super_Identifier<16U>.m_Value[6] = bRam00000000000000af;
    local_100.first.super_Identifier<16U>.m_Value[7] = bRam00000000000000b0;
    local_100.first.super_Identifier<16U>.m_Value[8] = (byte_t)uRam00000000000000b1;
    local_100.first.super_Identifier<16U>.m_Value[9] = uRam00000000000000b1._1_1_;
    local_100.first.super_Identifier<16U>.m_Value[10] = bRam00000000000000b3;
    local_100.first.super_Identifier<16U>.m_Value[0xb] = bRam00000000000000b4;
    local_100.first.super_Identifier<16U>.m_Value[0xc] = bRam00000000000000b5;
    local_100.first.super_Identifier<16U>.m_Value[0xd] = bRam00000000000000b6;
    local_100.first.super_Identifier<16U>.m_Value[0xe] = bRam00000000000000b7;
    local_100.first.super_Identifier<16U>.m_Value[0xf] = bRam00000000000000b8;
    local_100.first.super_Identifier<16U>.super_IArchive._vptr_IArchive =
         (_func_int **)&PTR__IArchive_00169290;
    local_100.second.super_Identifier<16U>.m_HasValue = *(bool *)(lVar5 + 8);
    local_100.second.super_Identifier<16U>.m_Value._0_8_ = *(undefined8 *)(lVar5 + 9);
    local_100.second.super_Identifier<16U>.m_Value._8_8_ = *(undefined8 *)(lVar5 + 0x11);
    local_100.second.super_Identifier<16U>.super_IArchive._vptr_IArchive =
         (_func_int **)&PTR__IArchive_00169290;
    std::
    _Rb_tree<Kumu::UUID,std::pair<Kumu::UUID_const,Kumu::UUID>,std::_Select1st<std::pair<Kumu::UUID_const,Kumu::UUID>>,std::less<Kumu::UUID>,std::allocator<std::pair<Kumu::UUID_const,Kumu::UUID>>>
    ::_M_insert_unique<std::pair<Kumu::UUID_const,Kumu::UUID>>
              ((_Rb_tree<Kumu::UUID,std::pair<Kumu::UUID_const,Kumu::UUID>,std::_Select1st<std::pair<Kumu::UUID_const,Kumu::UUID>>,std::less<Kumu::UUID>,std::allocator<std::pair<Kumu::UUID_const,Kumu::UUID>>>
                *)&TDesc[8].EncodingName._M_string_length,&local_100);
    lVar5 = lVar5 + 0x20;
  }
  Kumu::Result_t::Result_t((Result_t *)this,&result);
LAB_0014827b:
  Kumu::Result_t::~Result_t(&result);
  return this;
}

Assistant:

ASDCP::Result_t
AS_02::TimedText::MXFReader::h__Reader::MD_to_TimedText_TDesc(TimedTextDescriptor& TDesc)
{
  assert(m_EssenceDescriptor);
  memset(&m_TDesc.AssetID, 0, UUIDlen);
  ASDCP::MXF::TimedTextDescriptor* TDescObj = (ASDCP::MXF::TimedTextDescriptor*)m_EssenceDescriptor;

  TDesc.EditRate = TDescObj->SampleRate;
  if ( ! TDescObj->ContainerDuration.empty() )
    {
      assert(TDescObj->ContainerDuration <= 0xFFFFFFFFL);
      TDesc.ContainerDuration = (ui32_t) TDescObj->ContainerDuration;
    }
  memcpy(TDesc.AssetID, TDescObj->ResourceID.Value(), UUIDlen);
  TDesc.NamespaceName = TDescObj->NamespaceURI;
  TDesc.EncodingName = TDescObj->UCSEncoding;

  Array<Kumu::UUID>::const_iterator sdi = TDescObj->SubDescriptors.begin();
  TimedTextResourceSubDescriptor* DescObject = 0;
  Result_t result = RESULT_OK;

  for ( ; sdi != TDescObj->SubDescriptors.end() && KM_SUCCESS(result); sdi++ )
    {
      InterchangeObject* tmp_iobj = 0;
      result = m_HeaderPart.GetMDObjectByID(*sdi, &tmp_iobj);
      DescObject = static_cast<TimedTextResourceSubDescriptor*>(tmp_iobj);

      if ( KM_SUCCESS(result) )
	{
	  TimedTextResourceDescriptor TmpResource;
	  memcpy(TmpResource.ResourceID, DescObject->AncillaryResourceID.Value(), UUIDlen);

	  if ( DescObject->MIMEMediaType.find("application/x-font-opentype") != std::string::npos
	       || DescObject->MIMEMediaType.find("application/x-opentype") != std::string::npos
	       || DescObject->MIMEMediaType.find("font/opentype") != std::string::npos )
	    {
	      TmpResource.Type = ASDCP::TimedText::MT_OPENTYPE;
	    }
	  else if ( DescObject->MIMEMediaType.find("image/png") != std::string::npos )
	    {
	      TmpResource.Type = ASDCP::TimedText::MT_PNG;
	    }
	  else
	    {
	      TmpResource.Type = ASDCP::TimedText::MT_BIN;
	    }

	  TDesc.ResourceList.push_back(TmpResource);
	  m_ResourceMap.insert(ResourceMap_t::value_type(DescObject->AncillaryResourceID, *sdi));
	}
      else
	{
	  DefaultLogSink().Error("Broken sub-descriptor link\n");
	  return RESULT_FORMAT;
	}
    }

  return result;
}